

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__vertical_scatter_with_4_coeffs_cont
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  long lVar42;
  long lVar43;
  
  pfVar8 = *outputs;
  pfVar9 = outputs[1];
  fVar3 = *vertical_coefficients;
  fVar4 = vertical_coefficients[1];
  pfVar10 = outputs[2];
  fVar5 = vertical_coefficients[2];
  pfVar11 = outputs[3];
  fVar6 = vertical_coefficients[3];
  lVar42 = 0;
  for (lVar43 = (long)input_end - (long)input; 0x3f < lVar43; lVar43 = lVar43 + -0x40) {
    pfVar1 = (float *)((long)pfVar8 + lVar42);
    pfVar2 = (float *)((long)input + lVar42);
    fVar7 = *pfVar2;
    fVar12 = pfVar2[1];
    fVar13 = pfVar2[2];
    fVar14 = pfVar2[3];
    pfVar2 = (float *)((long)input + lVar42 + 0x10);
    fVar15 = *pfVar2;
    fVar16 = pfVar2[1];
    fVar17 = pfVar2[2];
    fVar18 = pfVar2[3];
    pfVar2 = (float *)((long)input + lVar42 + 0x20);
    fVar19 = *pfVar2;
    fVar20 = pfVar2[1];
    fVar21 = pfVar2[2];
    fVar22 = pfVar2[3];
    pfVar2 = (float *)((long)input + lVar42 + 0x30);
    fVar23 = *pfVar2;
    fVar24 = pfVar2[1];
    fVar25 = pfVar2[2];
    fVar26 = pfVar2[3];
    *pfVar1 = fVar3 * fVar7 + *pfVar1;
    pfVar1[1] = fVar3 * fVar12 + pfVar1[1];
    pfVar1[2] = fVar3 * fVar13 + pfVar1[2];
    pfVar1[3] = fVar3 * fVar14 + pfVar1[3];
    pfVar1[4] = fVar3 * fVar15 + pfVar1[4];
    pfVar1[5] = fVar3 * fVar16 + pfVar1[5];
    pfVar1[6] = fVar3 * fVar17 + pfVar1[6];
    pfVar1[7] = fVar3 * fVar18 + pfVar1[7];
    pfVar1[8] = fVar3 * fVar19 + pfVar1[8];
    pfVar1[9] = fVar3 * fVar20 + pfVar1[9];
    pfVar1[10] = fVar3 * fVar21 + pfVar1[10];
    pfVar1[0xb] = fVar3 * fVar22 + pfVar1[0xb];
    pfVar1[0xc] = fVar3 * fVar23 + pfVar1[0xc];
    pfVar1[0xd] = fVar3 * fVar24 + pfVar1[0xd];
    pfVar1[0xe] = fVar3 * fVar25 + pfVar1[0xe];
    pfVar1[0xf] = fVar3 * fVar26 + pfVar1[0xf];
    pfVar1 = (float *)((long)pfVar9 + lVar42);
    fVar27 = pfVar1[1];
    fVar28 = pfVar1[2];
    fVar29 = pfVar1[3];
    pfVar2 = (float *)((long)pfVar9 + lVar42 + 0x10);
    fVar30 = *pfVar2;
    fVar31 = pfVar2[1];
    fVar32 = pfVar2[2];
    fVar33 = pfVar2[3];
    pfVar2 = (float *)((long)pfVar9 + lVar42 + 0x20);
    fVar34 = *pfVar2;
    fVar35 = pfVar2[1];
    fVar36 = pfVar2[2];
    fVar37 = pfVar2[3];
    pfVar2 = (float *)((long)pfVar9 + lVar42 + 0x30);
    fVar38 = *pfVar2;
    fVar39 = pfVar2[1];
    fVar40 = pfVar2[2];
    fVar41 = pfVar2[3];
    pfVar2 = (float *)((long)pfVar9 + lVar42);
    *pfVar2 = fVar4 * fVar7 + *pfVar1;
    pfVar2[1] = fVar4 * fVar12 + fVar27;
    pfVar2[2] = fVar4 * fVar13 + fVar28;
    pfVar2[3] = fVar4 * fVar14 + fVar29;
    pfVar1 = (float *)((long)pfVar9 + lVar42 + 0x10);
    *pfVar1 = fVar4 * fVar15 + fVar30;
    pfVar1[1] = fVar4 * fVar16 + fVar31;
    pfVar1[2] = fVar4 * fVar17 + fVar32;
    pfVar1[3] = fVar4 * fVar18 + fVar33;
    pfVar1 = (float *)((long)pfVar9 + lVar42 + 0x20);
    *pfVar1 = fVar4 * fVar19 + fVar34;
    pfVar1[1] = fVar4 * fVar20 + fVar35;
    pfVar1[2] = fVar4 * fVar21 + fVar36;
    pfVar1[3] = fVar4 * fVar22 + fVar37;
    pfVar1 = (float *)((long)pfVar9 + lVar42 + 0x30);
    *pfVar1 = fVar4 * fVar23 + fVar38;
    pfVar1[1] = fVar4 * fVar24 + fVar39;
    pfVar1[2] = fVar4 * fVar25 + fVar40;
    pfVar1[3] = fVar4 * fVar26 + fVar41;
    pfVar1 = (float *)((long)pfVar10 + lVar42);
    fVar27 = pfVar1[1];
    fVar28 = pfVar1[2];
    fVar29 = pfVar1[3];
    pfVar2 = (float *)((long)pfVar10 + lVar42 + 0x10);
    fVar30 = *pfVar2;
    fVar31 = pfVar2[1];
    fVar32 = pfVar2[2];
    fVar33 = pfVar2[3];
    pfVar2 = (float *)((long)pfVar10 + lVar42 + 0x20);
    fVar34 = *pfVar2;
    fVar35 = pfVar2[1];
    fVar36 = pfVar2[2];
    fVar37 = pfVar2[3];
    pfVar2 = (float *)((long)pfVar10 + lVar42 + 0x30);
    fVar38 = *pfVar2;
    fVar39 = pfVar2[1];
    fVar40 = pfVar2[2];
    fVar41 = pfVar2[3];
    pfVar2 = (float *)((long)pfVar10 + lVar42);
    *pfVar2 = fVar5 * fVar7 + *pfVar1;
    pfVar2[1] = fVar5 * fVar12 + fVar27;
    pfVar2[2] = fVar5 * fVar13 + fVar28;
    pfVar2[3] = fVar5 * fVar14 + fVar29;
    pfVar1 = (float *)((long)pfVar10 + lVar42 + 0x10);
    *pfVar1 = fVar5 * fVar15 + fVar30;
    pfVar1[1] = fVar5 * fVar16 + fVar31;
    pfVar1[2] = fVar5 * fVar17 + fVar32;
    pfVar1[3] = fVar5 * fVar18 + fVar33;
    pfVar1 = (float *)((long)pfVar10 + lVar42 + 0x20);
    *pfVar1 = fVar5 * fVar19 + fVar34;
    pfVar1[1] = fVar5 * fVar20 + fVar35;
    pfVar1[2] = fVar5 * fVar21 + fVar36;
    pfVar1[3] = fVar5 * fVar22 + fVar37;
    pfVar1 = (float *)((long)pfVar10 + lVar42 + 0x30);
    *pfVar1 = fVar5 * fVar23 + fVar38;
    pfVar1[1] = fVar5 * fVar24 + fVar39;
    pfVar1[2] = fVar5 * fVar25 + fVar40;
    pfVar1[3] = fVar5 * fVar26 + fVar41;
    pfVar1 = (float *)((long)pfVar11 + lVar42);
    fVar27 = pfVar1[1];
    fVar28 = pfVar1[2];
    fVar29 = pfVar1[3];
    pfVar2 = (float *)((long)pfVar11 + lVar42 + 0x10);
    fVar30 = *pfVar2;
    fVar31 = pfVar2[1];
    fVar32 = pfVar2[2];
    fVar33 = pfVar2[3];
    pfVar2 = (float *)((long)pfVar11 + lVar42 + 0x20);
    fVar34 = *pfVar2;
    fVar35 = pfVar2[1];
    fVar36 = pfVar2[2];
    fVar37 = pfVar2[3];
    pfVar2 = (float *)((long)pfVar11 + lVar42 + 0x30);
    fVar38 = *pfVar2;
    fVar39 = pfVar2[1];
    fVar40 = pfVar2[2];
    fVar41 = pfVar2[3];
    pfVar2 = (float *)((long)pfVar11 + lVar42);
    *pfVar2 = fVar7 * fVar6 + *pfVar1;
    pfVar2[1] = fVar12 * fVar6 + fVar27;
    pfVar2[2] = fVar13 * fVar6 + fVar28;
    pfVar2[3] = fVar14 * fVar6 + fVar29;
    pfVar1 = (float *)((long)pfVar11 + lVar42 + 0x10);
    *pfVar1 = fVar15 * fVar6 + fVar30;
    pfVar1[1] = fVar16 * fVar6 + fVar31;
    pfVar1[2] = fVar17 * fVar6 + fVar32;
    pfVar1[3] = fVar18 * fVar6 + fVar33;
    pfVar1 = (float *)((long)pfVar11 + lVar42 + 0x20);
    *pfVar1 = fVar19 * fVar6 + fVar34;
    pfVar1[1] = fVar20 * fVar6 + fVar35;
    pfVar1[2] = fVar21 * fVar6 + fVar36;
    pfVar1[3] = fVar22 * fVar6 + fVar37;
    pfVar1 = (float *)((long)pfVar11 + lVar42 + 0x30);
    *pfVar1 = fVar23 * fVar6 + fVar38;
    pfVar1[1] = fVar24 * fVar6 + fVar39;
    pfVar1[2] = fVar25 * fVar6 + fVar40;
    pfVar1[3] = fVar26 * fVar6 + fVar41;
    lVar42 = lVar42 + 0x40;
  }
  for (; pfVar1 = (float *)((long)pfVar8 + lVar42), 0xf < lVar43; lVar43 = lVar43 + -0x10) {
    pfVar2 = (float *)((long)input + lVar42);
    fVar7 = *pfVar2;
    fVar12 = pfVar2[1];
    fVar13 = pfVar2[2];
    fVar14 = pfVar2[3];
    *pfVar1 = fVar3 * fVar7 + *pfVar1;
    pfVar1[1] = fVar3 * fVar12 + pfVar1[1];
    pfVar1[2] = fVar3 * fVar13 + pfVar1[2];
    pfVar1[3] = fVar3 * fVar14 + pfVar1[3];
    pfVar1 = (float *)((long)pfVar9 + lVar42);
    fVar15 = pfVar1[1];
    fVar16 = pfVar1[2];
    fVar17 = pfVar1[3];
    pfVar2 = (float *)((long)pfVar9 + lVar42);
    *pfVar2 = fVar4 * fVar7 + *pfVar1;
    pfVar2[1] = fVar4 * fVar12 + fVar15;
    pfVar2[2] = fVar4 * fVar13 + fVar16;
    pfVar2[3] = fVar4 * fVar14 + fVar17;
    pfVar1 = (float *)((long)pfVar10 + lVar42);
    fVar15 = pfVar1[1];
    fVar16 = pfVar1[2];
    fVar17 = pfVar1[3];
    pfVar2 = (float *)((long)pfVar10 + lVar42);
    *pfVar2 = fVar5 * fVar7 + *pfVar1;
    pfVar2[1] = fVar5 * fVar12 + fVar15;
    pfVar2[2] = fVar5 * fVar13 + fVar16;
    pfVar2[3] = fVar5 * fVar14 + fVar17;
    pfVar1 = (float *)((long)pfVar11 + lVar42);
    fVar15 = pfVar1[1];
    fVar16 = pfVar1[2];
    fVar17 = pfVar1[3];
    pfVar2 = (float *)((long)pfVar11 + lVar42);
    *pfVar2 = fVar7 * fVar6 + *pfVar1;
    pfVar2[1] = fVar12 * fVar6 + fVar15;
    pfVar2[2] = fVar13 * fVar6 + fVar16;
    pfVar2[3] = fVar14 * fVar6 + fVar17;
    lVar42 = lVar42 + 0x10;
  }
  for (lVar43 = 0; (float *)((long)input + lVar43 + lVar42) < input_end; lVar43 = lVar43 + 4) {
    fVar7 = *(float *)((long)input + lVar42 + lVar43);
    *(float *)((long)pfVar8 + lVar42 + lVar43) =
         fVar3 * fVar7 + *(float *)((long)pfVar8 + lVar42 + lVar43);
    *(float *)((long)pfVar9 + lVar42 + lVar43) =
         fVar4 * fVar7 + *(float *)((long)pfVar9 + lVar42 + lVar43);
    *(float *)((long)pfVar10 + lVar42 + lVar43) =
         fVar5 * fVar7 + *(float *)((long)pfVar10 + lVar42 + lVar43);
    *(float *)((long)pfVar11 + lVar42 + lVar43) =
         fVar7 * fVar6 + *(float *)((long)pfVar11 + lVar42 + lVar43);
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}